

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldisc.c
# Opt level: O1

void ldisc_free(Ldisc *ldisc)

{
  Backend *pBVar1;
  prompts_t *ppVar2;
  
  bufchain_clear(&ldisc->input_queue);
  if (ldisc->term != (Terminal *)0x0) {
    ldisc->term->ldisc = (Ldisc *)0x0;
  }
  pBVar1 = ldisc->backend;
  if (pBVar1 != (Backend *)0x0) {
    (*pBVar1->vt->provide_ldisc)(pBVar1,(Ldisc *)0x0);
  }
  if (ldisc->buf != (char *)0x0) {
    safefree(ldisc->buf);
  }
  ppVar2 = ldisc->prompts;
  if ((ppVar2 != (prompts_t *)0x0) && (ppVar2->ldisc_ptr_to_us == &ldisc->prompts)) {
    ppVar2->ldisc_ptr_to_us = (prompts_t **)0x0;
  }
  delete_callbacks_for_context(ldisc);
  safefree(ldisc);
  return;
}

Assistant:

void ldisc_free(Ldisc *ldisc)
{
    bufchain_clear(&ldisc->input_queue);
    if (ldisc->term)
        ldisc->term->ldisc = NULL;
    if (ldisc->backend)
        backend_provide_ldisc(ldisc->backend, NULL);
    if (ldisc->buf)
        sfree(ldisc->buf);
    if (ldisc->prompts && ldisc->prompts->ldisc_ptr_to_us == &ldisc->prompts)
        ldisc->prompts->ldisc_ptr_to_us = NULL;
    delete_callbacks_for_context(ldisc);
    sfree(ldisc);
}